

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

void find_levels_r(opt_state_t *opt_state,icode *ic,block *b)

{
  int iVar1;
  block *b_00;
  block **ppbVar2;
  int iVar3;
  
  if (b->mark != ic->cur_mark) {
    b->mark = ic->cur_mark;
    b->link = (block *)0x0;
    b_00 = (b->et).succ;
    if (b_00 == (block *)0x0) {
      iVar3 = 0;
    }
    else {
      find_levels_r(opt_state,ic,b_00);
      find_levels_r(opt_state,ic,(b->ef).succ);
      iVar1 = ((b->et).succ)->level;
      iVar3 = ((b->ef).succ)->level;
      if (iVar3 < iVar1) {
        iVar3 = iVar1;
      }
      iVar3 = iVar3 + 1;
    }
    b->level = iVar3;
    ppbVar2 = opt_state->levels;
    b->link = ppbVar2[iVar3];
    ppbVar2[iVar3] = b;
  }
  return;
}

Assistant:

static void
find_levels_r(opt_state_t *opt_state, struct icode *ic, struct block *b)
{
	int level;

	if (isMarked(ic, b))
		return;

	Mark(ic, b);
	b->link = 0;

	if (JT(b)) {
		find_levels_r(opt_state, ic, JT(b));
		find_levels_r(opt_state, ic, JF(b));
		level = MAX(JT(b)->level, JF(b)->level) + 1;
	} else
		level = 0;
	b->level = level;
	b->link = opt_state->levels[level];
	opt_state->levels[level] = b;
}